

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

gdImagePtr gdImageClone(gdImagePtr src)

{
  int *piVar1;
  int *piVar2;
  gdImagePtr im;
  long lVar3;
  gdImagePtr pgVar4;
  long lVar5;
  
  if (src->trueColor == 0) {
    im = gdImageCreate(src->sx,src->sy);
  }
  else {
    im = gdImageCreateTrueColor(src->sx,src->sy);
  }
  if (im == (gdImagePtr)0x0) {
    im = (gdImagePtr)0x0;
  }
  else {
    if (src->trueColor == 0) {
      im->colorsTotal = src->colorsTotal;
      lVar3 = 0;
      do {
        im->red[lVar3] = src->red[lVar3];
        im->green[lVar3] = src->green[lVar3];
        im->blue[lVar3] = src->blue[lVar3];
        im->alpha[lVar3] = src->alpha[lVar3];
        im->open[lVar3] = src->open[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x100);
    }
    else if (0 < src->sy) {
      lVar3 = 0;
      do {
        if (0 < src->sx) {
          piVar1 = src->tpixels[lVar3];
          piVar2 = im->tpixels[lVar3];
          lVar5 = 0;
          do {
            piVar2[lVar5] = piVar1[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 < src->sx);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < src->sy);
    }
    if (0 < src->styleLength) {
      im->styleLength = src->styleLength;
      im->stylePos = src->stylePos;
      if (0 < src->styleLength) {
        piVar1 = src->style;
        piVar2 = im->style;
        lVar3 = 0;
        do {
          piVar2[lVar3] = piVar1[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 < src->styleLength);
      }
    }
    im->interlace = src->interlace;
    im->alphaBlendingFlag = src->alphaBlendingFlag;
    im->saveAlphaFlag = src->saveAlphaFlag;
    im->AA = src->AA;
    im->AA_color = src->AA_color;
    im->AA_dont_blend = src->AA_dont_blend;
    im->cx1 = src->cx1;
    im->cy1 = src->cy1;
    im->cx2 = src->cx2;
    im->cy2 = src->cy2;
    im->res_x = src->res_x;
    im->res_y = src->res_x;
    im->paletteQuantizationMethod = src->paletteQuantizationMethod;
    im->paletteQuantizationSpeed = src->paletteQuantizationSpeed;
    im->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
    im->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
    im->interpolation_id = src->interpolation_id;
    im->interpolation = src->interpolation;
    if (src->brush != (gdImagePtr)0x0) {
      pgVar4 = gdImageClone(src->brush);
      im->brush = pgVar4;
    }
    if (src->tile != (gdImagePtr)0x0) {
      pgVar4 = gdImageClone(src->tile);
      im->tile = pgVar4;
    }
    if (src->style != (int *)0x0) {
      gdImageSetStyle(im,src->style,src->styleLength);
    }
    lVar3 = 0x50e;
    do {
      *(undefined4 *)((long)im + lVar3 * 4 + -0x400) =
           *(undefined4 *)((long)src + lVar3 * 4 + -0x400);
      im->red[lVar3 + -5] = src->red[lVar3 + -5];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x60e);
    if ((0 < src->polyAllocated) && (im->polyAllocated = src->polyAllocated, 0 < src->polyAllocated)
       ) {
      piVar1 = src->polyInts;
      piVar2 = im->polyInts;
      lVar3 = 0;
      do {
        piVar2[lVar3] = piVar1[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 < src->polyAllocated);
    }
  }
  return im;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageClone (gdImagePtr src) {
	gdImagePtr dst;
	register int i, x;

	if (src->trueColor) {
		dst = gdImageCreateTrueColor(src->sx , src->sy);
	} else {
		dst = gdImageCreate(src->sx , src->sy);
	}

	if (dst == NULL) {
		return NULL;
	}

	if (src->trueColor == 0) {
		dst->colorsTotal = src->colorsTotal;
		for (i = 0; i < gdMaxColors; i++) {
			dst->red[i]   = src->red[i];
			dst->green[i] = src->green[i];
			dst->blue[i]  = src->blue[i];
			dst->alpha[i] = src->alpha[i];
			dst->open[i]  = src->open[i];
		}
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->pixels[i][x] = dst->pixels[i][x];
			}
		}
	} else {
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->tpixels[i][x] = src->tpixels[i][x];
			}
		}
	}

	if (src->styleLength > 0) {
		dst->styleLength = src->styleLength;
		dst->stylePos    = src->stylePos;
		for (i = 0; i < src->styleLength; i++) {
			dst->style[i] = src->style[i];
		}
	}

	dst->interlace   = src->interlace;

	dst->alphaBlendingFlag = src->alphaBlendingFlag;
	dst->saveAlphaFlag     = src->saveAlphaFlag;
	dst->AA                = src->AA;
	dst->AA_color          = src->AA_color;
	dst->AA_dont_blend     = src->AA_dont_blend;

	dst->cx1 = src->cx1;
	dst->cy1 = src->cy1;
	dst->cx2 = src->cx2;
	dst->cy2 = src->cy2;

	dst->res_x = src->res_x;
	dst->res_y = src->res_x;

	dst->paletteQuantizationMethod     = src->paletteQuantizationMethod;
	dst->paletteQuantizationSpeed      = src->paletteQuantizationSpeed;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;

	dst->interpolation_id = src->interpolation_id;
	dst->interpolation    = src->interpolation;

	if (src->brush) {
		dst->brush = gdImageClone(src->brush);
	}

	if (src->tile) {
		dst->tile = gdImageClone(src->tile);
	}

	if (src->style) {
		gdImageSetStyle(dst, src->style, src->styleLength);
	}

	for (i = 0; i < gdMaxColors; i++) {
		dst->brushColorMap[i] = src->brushColorMap[i];
		dst->tileColorMap[i] = src->tileColorMap[i];
	}

	if (src->polyAllocated > 0) {
		dst->polyAllocated = src->polyAllocated;
		for (i = 0; i < src->polyAllocated; i++) {
			dst->polyInts[i] = src->polyInts[i];
		}
	}

	return dst;
}